

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O1

void fejer2_set(int n,double *xtab,double *weight)

{
  ostream *poVar1;
  
  switch(n) {
  case 1:
    *xtab = 0.0;
    *weight = 2.0;
    break;
  case 2:
    *xtab = -0.5;
    xtab[1] = 0.5;
    *weight = 1.0;
    weight[1] = 1.0;
    break;
  case 3:
    *xtab = -0.7071067811865476;
    xtab[1] = 0.0;
    xtab[2] = 0.7071067811865476;
    *weight = 0.6666666666666666;
    weight[1] = 0.6666666666666666;
    weight[2] = 0.6666666666666666;
    break;
  case 4:
    *xtab = -0.8090169943749475;
    xtab[1] = -0.3090169943749475;
    xtab[2] = 0.3090169943749475;
    xtab[3] = 0.8090169943749475;
    *weight = 0.425464400750007;
    weight[1] = 0.574535599249993;
    weight[2] = 0.574535599249993;
    weight[3] = 0.425464400750007;
    break;
  case 5:
    *xtab = -0.8660254037844387;
    xtab[1] = -0.5;
    xtab[2] = 0.0;
    xtab[3] = 0.5;
    xtab[4] = 0.8660254037844387;
    *weight = 0.3111111111111111;
    weight[1] = 0.4;
    weight[2] = 0.5777777777777777;
    weight[3] = 0.4;
    weight[4] = 0.3111111111111111;
    break;
  case 6:
    *xtab = -0.9009688679024191;
    xtab[1] = -0.6234898018587336;
    xtab[2] = -0.2225209339563144;
    xtab[3] = 0.2225209339563144;
    xtab[4] = 0.6234898018587336;
    xtab[5] = 0.9009688679024191;
    *weight = 0.2269152467244296;
    weight[1] = 0.3267938603769863;
    weight[2] = 0.4462908928985841;
    weight[3] = 0.4462908928985841;
    weight[4] = 0.3267938603769863;
    weight[5] = 0.2269152467244296;
    break;
  case 7:
    *xtab = -0.9238795325112867;
    xtab[1] = -0.7071067811865476;
    xtab[2] = -0.3826834323650898;
    xtab[3] = 0.0;
    xtab[4] = 0.3826834323650898;
    xtab[5] = 0.7071067811865476;
    xtab[6] = 0.9238795325112867;
    *weight = 0.1779646809620499;
    weight[1] = 0.2476190476190476;
    weight[2] = 0.3934638904665215;
    weight[3] = 0.3619047619047619;
    weight[4] = 0.3934638904665215;
    weight[5] = 0.2476190476190476;
    weight[6] = 0.1779646809620499;
    break;
  case 8:
    *xtab = -0.9396926207859084;
    xtab[1] = -0.766044443118978;
    xtab[2] = -0.5;
    xtab[3] = -0.1736481776669304;
    xtab[4] = 0.1736481776669304;
    xtab[5] = 0.5;
    xtab[6] = 0.766044443118978;
    xtab[7] = 0.9396926207859084;
    *weight = 0.1397697435050225;
    weight[1] = 0.2063696457302284;
    weight[2] = 0.3142857142857143;
    weight[3] = 0.3395748964790348;
    weight[4] = 0.3395748964790348;
    weight[5] = 0.3142857142857143;
    weight[6] = 0.2063696457302284;
    weight[7] = 0.1397697435050225;
    break;
  case 9:
    *xtab = -0.9510565162951535;
    xtab[1] = -0.8090169943749475;
    xtab[2] = -0.5877852522924731;
    xtab[3] = -0.3090169943749475;
    xtab[4] = 0.0;
    xtab[5] = 0.3090169943749475;
    xtab[6] = 0.5877852522924731;
    xtab[7] = 0.8090169943749475;
    xtab[8] = 0.9510565162951535;
    *weight = 0.1147810750857217;
    weight[1] = 0.1654331942222276;
    weight[2] = 0.2737903534857068;
    weight[3] = 0.279011250222217;
    weight[4] = 0.3339682539682539;
    weight[5] = 0.279011250222217;
    weight[6] = 0.2737903534857068;
    weight[7] = 0.1654331942222276;
    weight[8] = 0.1147810750857217;
    break;
  case 10:
    *xtab = -0.9594929736144974;
    xtab[1] = -0.8412535328311812;
    xtab[2] = -0.6548607339452851;
    xtab[3] = -0.4154150130018864;
    xtab[4] = -0.1423148382732851;
    xtab[5] = 0.1423148382732851;
    xtab[6] = 0.4154150130018864;
    xtab[7] = 0.6548607339452851;
    xtab[8] = 0.8412535328311812;
    xtab[9] = 0.9594929736144974;
    *weight = 0.09441954173982806;
    weight[1] = 0.1411354380109716;
    weight[2] = 0.2263866903636005;
    weight[3] = 0.2530509772156453;
    weight[4] = 0.2850073526699544;
    weight[5] = 0.2850073526699544;
    weight[6] = 0.2530509772156453;
    weight[7] = 0.2263866903636005;
    weight[8] = 0.1411354380109716;
    weight[9] = 0.09441954173982806;
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FEJER2_SET - Fatal error!\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal value of N = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
    std::operator<<(poVar1,"\n");
    std::operator<<((ostream *)&std::cerr,"  Legal values are 1 through 10.\n");
    exit(1);
  }
  return;
}

Assistant:

void fejer2_set ( int n, double xtab[], double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEJER2_SET sets abscissas and weights for Fejer type 2 quadrature.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 March 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//    Walter Gautschi,
//    Numerical Quadrature in the Presence of a Singularity,
//    SIAM Journal on Numerical Analysis,
//    Volume 4, Number 3, 1967, pages 357-362.
//
//    Joerg Waldvogel,
//    Fast Construction of the Fejer and Clenshaw-Curtis Quadrature Rules,
//    BIT Numerical Mathematics,
//    Volume 43, Number 1, 2003, pages 1-18.
//
//  Parameters:
//
//    Input, int N, the order.  
//    N should be between 1 and 10.
//
//    Output, double XTAB[N], the abscissas.
//
//    Output, double WEIGHT[N], the weights.
//
{
  if ( n == 1 )
  {
    xtab[0]   =  0.000000000000000;
    weight[0] =  2.000000000000000;
  }
  else if ( n == 2 )
  {
    xtab[0] =   -0.5000000000000000;
    xtab[1] =    0.5000000000000000;

    weight[0] =  1.0000000000000000;
    weight[1] =  1.0000000000000000;
  }
  else if ( n == 3 )
  {
    xtab[0] =  -0.7071067811865476;
    xtab[1] =   0.0000000000000000;
    xtab[2] =   0.7071067811865476;

    weight[0] =  0.6666666666666666;
    weight[1] =  0.6666666666666666;
    weight[2] =  0.6666666666666666;
  }                  
  else if ( n == 4 )
  {
    xtab[0] =  -0.8090169943749475;
    xtab[1] =  -0.3090169943749475;
    xtab[2] =   0.3090169943749475;
    xtab[3] =   0.8090169943749475;

    weight[0] = 0.4254644007500070;
    weight[1] = 0.5745355992499930;
    weight[2] = 0.5745355992499930;
    weight[3] = 0.4254644007500070;
  }
  else if ( n == 5 )
  {
    xtab[0] =  -0.8660254037844387;
    xtab[1] =  -0.5000000000000000;
    xtab[2] =   0.0000000000000000;
    xtab[3] =   0.5000000000000000;
    xtab[4] =   0.8660254037844387;  

    weight[0] = 0.3111111111111111;
    weight[1] = 0.4000000000000000;
    weight[2] = 0.5777777777777777;
    weight[3] = 0.4000000000000000;
    weight[4] = 0.3111111111111111;
  }
  else if ( n == 6 )
  {
    xtab[0] =  -0.9009688679024191;
    xtab[1] =  -0.6234898018587336;
    xtab[2] =  -0.2225209339563144;
    xtab[3] =   0.2225209339563144;
    xtab[4] =   0.6234898018587336;
    xtab[5] =   0.9009688679024191;
      
    weight[0] = 0.2269152467244296;
    weight[1] = 0.3267938603769863;
    weight[2] = 0.4462908928985841;
    weight[3] = 0.4462908928985841;
    weight[4] = 0.3267938603769863;
    weight[5] = 0.2269152467244296;
  }
  else if ( n == 7 )
  {
    xtab[0] =  -0.9238795325112867;
    xtab[1] =  -0.7071067811865476;
    xtab[2] =  -0.3826834323650898;
    xtab[3] =   0.0000000000000000;
    xtab[4] =   0.3826834323650898;
    xtab[5] =   0.7071067811865476;
    xtab[6] =   0.9238795325112867;    
                    
    weight[0] = 0.1779646809620499;
    weight[1] = 0.2476190476190476;
    weight[2] = 0.3934638904665215;
    weight[3] = 0.3619047619047619;
    weight[4] = 0.3934638904665215;
    weight[5] = 0.2476190476190476;
    weight[6] = 0.1779646809620499;
  }
  else if ( n == 8 )
  {
    xtab[0] =  -0.9396926207859084;
    xtab[1] =  -0.7660444431189780;
    xtab[2] =  -0.5000000000000000;
    xtab[3] =  -0.1736481776669304;
    xtab[4] =   0.1736481776669304;
    xtab[5] =   0.5000000000000000;
    xtab[6] =   0.7660444431189780;
    xtab[7] =   0.9396926207859084;
                        
    weight[0] = 0.1397697435050225;
    weight[1] = 0.2063696457302284;
    weight[2] = 0.3142857142857143;
    weight[3] = 0.3395748964790348;
    weight[4] = 0.3395748964790348;
    weight[5] = 0.3142857142857143;
    weight[6] = 0.2063696457302284;
    weight[7] = 0.1397697435050225;
  }
  else if ( n == 9 )
  {
    xtab[0] =  -0.9510565162951535;
    xtab[1] =  -0.8090169943749475;
    xtab[2] =  -0.5877852522924731;
    xtab[3] =  -0.3090169943749475;
    xtab[4] =   0.0000000000000000;
    xtab[5] =   0.3090169943749475;
    xtab[6] =   0.5877852522924731;
    xtab[7] =   0.8090169943749475;
    xtab[8] =   0.9510565162951535;
                       
    weight[0] = 0.1147810750857217;
    weight[1] = 0.1654331942222276;
    weight[2] = 0.2737903534857068;
    weight[3] = 0.2790112502222170;
    weight[4] = 0.3339682539682539;
    weight[5] = 0.2790112502222170;
    weight[6] = 0.2737903534857068;
    weight[7] = 0.1654331942222276;
    weight[8] = 0.1147810750857217;
  }
  else if ( n == 10 )
  {
    xtab[0] =  -0.9594929736144974;
    xtab[1] =  -0.8412535328311812;
    xtab[2] =  -0.6548607339452851;
    xtab[3] =  -0.4154150130018864;
    xtab[4] =  -0.1423148382732851;
    xtab[5] =   0.1423148382732851;
    xtab[6] =   0.4154150130018864;
    xtab[7] =   0.6548607339452851;
    xtab[8] =   0.8412535328311812;
    xtab[9] =   0.9594929736144974;
  
    weight[0] = 0.09441954173982806;
    weight[1] = 0.1411354380109716; 
    weight[2] = 0.2263866903636005;
    weight[3] = 0.2530509772156453;
    weight[4] = 0.2850073526699544;
    weight[5] = 0.2850073526699544;
    weight[6] = 0.2530509772156453;
    weight[7] = 0.2263866903636005;
    weight[8] = 0.1411354380109716;
    weight[9] = 0.09441954173982806;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "FEJER2_SET - Fatal error!\n";
    std::cerr << "  Illegal value of N = " << n << "\n";
    std::cerr << "  Legal values are 1 through 10.\n";
    exit ( 1 );
  }

  return;
}